

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy.hpp
# Opt level: O1

vector<Sphere,_std::allocator<Sphere>_> *
sphere_tree_leaves(vector<Sphere,_std::allocator<Sphere>_> *__return_storage_ptr__,SphereTree *tree)

{
  pointer pSVar1;
  pointer tree_00;
  initializer_list<Sphere> __l;
  vector<Sphere,_std::allocator<Sphere>_> v;
  allocator_type local_39;
  vector<Sphere,_std::allocator<Sphere>_> local_38;
  
  tree_00 = (tree->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (tree->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (tree_00 == pSVar1) {
    local_38.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)&(tree->bound).center;
    local_38.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)&(tree->bound).center.z;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_38;
    std::vector<Sphere,_std::allocator<Sphere>_>::vector(__return_storage_ptr__,__l,&local_39);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      sphere_tree_leaves(&local_38,tree_00);
      std::vector<Sphere,std::allocator<Sphere>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Sphere*,std::vector<Sphere,std::allocator<Sphere>>>>
                ((vector<Sphere,std::allocator<Sphere>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_38.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_38.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_38.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      tree_00 = tree_00 + 1;
    } while (tree_00 != pSVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sphere> sphere_tree_leaves(const SphereTree& tree)
{
	if (tree.child.empty()) return {tree.bound};
	std::vector<Sphere> res;
	for (const SphereTree& c: tree.child)
	{
		std::vector<Sphere> v = sphere_tree_leaves(c);
		res.insert(res.end(), v.begin(), v.end());
	}
	return res;
}